

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

TaggedStringPtr __thiscall
google::protobuf::internal::TaggedStringPtr::Copy
          (TaggedStringPtr *this,Arena *arena,LazyString *default_value)

{
  bool bVar1;
  LazyString *default_value_local;
  Arena *arena_local;
  TaggedStringPtr *this_local;
  
  bVar1 = IsDefault(this);
  if (bVar1) {
    this_local = (TaggedStringPtr *)this->ptr_;
  }
  else {
    this_local = (TaggedStringPtr *)ForceCopy(this,arena);
  }
  return (TaggedStringPtr)this_local;
}

Assistant:

inline TaggedStringPtr TaggedStringPtr::Copy(
    Arena* arena, const LazyString& default_value) const {
  if (DebugHardenForceCopyDefaultString()) {
    // Harden by forcing an allocated string value.
    TaggedStringPtr hardened(*this);
    if (IsDefault()) {
      hardened.SetDefault(&default_value.get());
    }
    return hardened.ForceCopy(arena);
  }
  return IsDefault() ? *this : ForceCopy(arena);
}